

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O1

void __thiscall CaDiCaL::External::push_clause_literal_on_extension_stack(External *this,int ilit)

{
  int iVar1;
  iterator __position;
  int iVar2;
  ulong uVar3;
  int elit;
  int local_4;
  
  uVar3 = (ulong)(uint)-ilit;
  if (0 < ilit) {
    uVar3 = (ulong)(uint)ilit;
  }
  iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3];
  iVar2 = -iVar1;
  if (-1 < ilit) {
    iVar2 = iVar1;
  }
  __position._M_current =
       (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->extension,__position,&local_4);
  }
  else {
    *__position._M_current = iVar2;
    (this->extension).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void External::push_clause_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing clause literal %d on extension stack (internal %d)", elit,
       ilit);
}